

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_case.cpp
# Opt level: O0

void duckdb::TemplatedFillLoop<duckdb::list_entry_t>
               (Vector *vector,Vector *result,SelectionVector *sel,sel_t count)

{
  uint64_t uVar1;
  VectorType VVar2;
  bool bVar3;
  list_entry_t *plVar4;
  Vector *this;
  list_entry_t *plVar5;
  idx_t iVar6;
  TemplatedValidityMask<unsigned_long> *this_00;
  uint in_ECX;
  SelectionVector *in_RDX;
  Vector *in_RDI;
  idx_t res_idx;
  idx_t source_idx;
  idx_t i_2;
  list_entry_t *data_1;
  UnifiedVectorFormat vdata;
  idx_t i_1;
  idx_t i;
  list_entry_t *data;
  ValidityMask *result_mask;
  list_entry_t *res;
  idx_t in_stack_fffffffffffffef8;
  Vector *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined8 in_stack_ffffffffffffff28;
  Vector *in_stack_ffffffffffffff30;
  list_entry_t *plVar7;
  ulong uStack_b0;
  UnifiedVectorFormat UStack_90;
  ulong uStack_48;
  UnifiedVectorFormat *in_stack_ffffffffffffffc0;
  ulong idx;
  idx_t in_stack_ffffffffffffffc8;
  list_entry_t *plVar8;
  
  Vector::SetVectorType
            (in_stack_ffffffffffffff30,(VectorType)((ulong)in_stack_ffffffffffffff28 >> 0x38));
  plVar4 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x2e2acb2);
  this = (Vector *)FlatVector::Validity((Vector *)0x2e2acc7);
  VVar2 = Vector::GetVectorType(in_RDI);
  if (VVar2 == CONSTANT_VECTOR) {
    plVar5 = ConstantVector::GetData<duckdb::list_entry_t>((Vector *)0x2e2acf1);
    bVar3 = ConstantVector::IsNull((Vector *)0x2e2ad06);
    if (bVar3) {
      for (idx = 0; idx < in_ECX; idx = idx + 1) {
        SelectionVector::get_index(in_RDX,idx);
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  ((TemplatedValidityMask<unsigned_long> *)in_stack_ffffffffffffff00,
                   in_stack_fffffffffffffef8);
      }
    }
    else {
      for (uStack_48 = 0; uStack_48 < in_ECX; uStack_48 = uStack_48 + 1) {
        plVar7 = plVar4;
        plVar8 = plVar5;
        iVar6 = SelectionVector::get_index(in_RDX,uStack_48);
        plVar7[iVar6].offset = plVar5->offset;
        plVar7[iVar6].length = plVar5->length;
        plVar5 = plVar8;
      }
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10))
    ;
    Vector::ToUnifiedFormat(this,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    plVar5 = UnifiedVectorFormat::GetData<duckdb::list_entry_t>(&UStack_90);
    for (uStack_b0 = 0; uStack_b0 < in_ECX; uStack_b0 = uStack_b0 + 1) {
      iVar6 = SelectionVector::get_index(UStack_90.sel,uStack_b0);
      in_stack_ffffffffffffff00 = this;
      this_00 = (TemplatedValidityMask<unsigned_long> *)SelectionVector::get_index(in_RDX,uStack_b0)
      ;
      uVar1 = plVar5[iVar6].length;
      plVar4[(long)this_00].offset = plVar5[iVar6].offset;
      plVar4[(long)this_00].length = uVar1;
      this = in_stack_ffffffffffffff00;
      bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (this_00,(idx_t)in_stack_ffffffffffffff00);
      TemplatedValidityMask<unsigned_long>::Set
                ((TemplatedValidityMask<unsigned_long> *)CONCAT17(bVar3,in_stack_ffffffffffffff10),
                 (idx_t)this_00,SUB81((ulong)in_stack_ffffffffffffff00 >> 0x38,0));
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_ffffffffffffff00);
  }
  return;
}

Assistant:

void TemplatedFillLoop(Vector &vector, Vector &result, const SelectionVector &sel, sel_t count) {
	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto res = FlatVector::GetData<T>(result);
	auto &result_mask = FlatVector::Validity(result);
	if (vector.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto data = ConstantVector::GetData<T>(vector);
		if (ConstantVector::IsNull(vector)) {
			for (idx_t i = 0; i < count; i++) {
				result_mask.SetInvalid(sel.get_index(i));
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				res[sel.get_index(i)] = *data;
			}
		}
	} else {
		UnifiedVectorFormat vdata;
		vector.ToUnifiedFormat(count, vdata);
		auto data = UnifiedVectorFormat::GetData<T>(vdata);
		for (idx_t i = 0; i < count; i++) {
			auto source_idx = vdata.sel->get_index(i);
			auto res_idx = sel.get_index(i);

			res[res_idx] = data[source_idx];
			result_mask.Set(res_idx, vdata.validity.RowIsValid(source_idx));
		}
	}
}